

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_optimizer.cpp
# Opt level: O3

tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
pfederc::optimizeUnOpExpr(UnOpExpr *expr,size_t *reducedexpressions)

{
  Lexer *lexer;
  Token *tokOp;
  UnOpExpr *this;
  size_t *in_RDX;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> extraout_RDX;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> extraout_RDX_00;
  _Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false> _Var1;
  pointer __p;
  tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool> tVar2;
  _Head_base<0UL,_pfederc::Expr_*,_false> local_40;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> local_38;
  
  local_40._M_head_impl = (Expr *)reducedexpressions[8];
  reducedexpressions[8] = 0;
  optimizeAll((pfederc *)&local_38,
              (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&local_40,in_RDX);
  if (local_40._M_head_impl != (Expr *)0x0) {
    (*(local_40._M_head_impl)->_vptr_Expr[1])();
  }
  lexer = (Lexer *)reducedexpressions[2];
  tokOp = (Token *)reducedexpressions[7];
  this = (UnOpExpr *)operator_new(0x48);
  UnOpExpr::UnOpExpr(this,lexer,(Position *)(reducedexpressions + 4),tokOp,&local_38);
  local_40._M_head_impl = (Expr *)0x0;
  std::unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>::~unique_ptr
            ((unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_> *)&local_40);
  UnOpExpr::~UnOpExpr((UnOpExpr *)reducedexpressions);
  operator_delete(reducedexpressions,0x48);
  *(undefined1 *)&(expr->super_Expr)._vptr_Expr = 0;
  (expr->super_Expr).parent = (Expr *)this;
  _Var1._M_head_impl._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
  _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
       (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
       extraout_RDX._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
       _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  if ((tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)
      local_38._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl !=
      (_Head_base<0UL,_pfederc::Expr_*,_false>)0x0) {
    (**(code **)(*(long *)local_38._M_t.
                          super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                          .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 8))();
    _Var1._M_head_impl._M_t.
    super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
         (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
         extraout_RDX_00._M_t.
         super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
         super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
         super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  }
  tVar2.
  super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>.
  super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>.
  _M_head_impl._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       _Var1._M_head_impl._M_t.
       super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
       super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  tVar2.
  super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>.
  _0_8_ = expr;
  return (tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>)
         tVar2.
         super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
  ;
}

Assistant:

std::tuple<std::unique_ptr<Expr>, bool /* changed */> pfederc::optimizeUnOpExpr(
    UnOpExpr *expr, size_t &reducedexpressions) noexcept {
  std::unique_ptr<Expr> newincludedexpr = optimizeAll(expr->getExpressionPtr(), reducedexpressions);
  std::unique_ptr<Expr> newexpr = std::make_unique<UnOpExpr>(expr->getLexer(),
      expr->getPosition(), &(expr->getOperatorToken()),
        std::move(newincludedexpr));
  delete expr;

  return std::tuple<std::unique_ptr<Expr>, bool>(std::move(newexpr), false);
}